

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void kboxinit(gost_ctx *c,gost_subst_block *b)

{
  int iVar1;
  int i;
  gost_subst_block *b_local;
  gost_ctx *c_local;
  
  for (i = 0; i < 0x100; i = i + 1) {
    iVar1 = i >> 4;
    c->k87[i] = ((uint)b->k8[iVar1] << 4 | (uint)b->k7[(int)(i & 0xf)]) << 0x18;
    c->k65[i] = ((uint)b->k6[iVar1] << 4 | (uint)b->k5[(int)(i & 0xf)]) << 0x10;
    c->k43[i] = ((uint)b->k4[iVar1] << 4 | (uint)b->k3[(int)(i & 0xf)]) << 8;
    c->k21[i] = (uint)b->k2[iVar1] << 4 | (uint)b->k1[(int)(i & 0xf)];
  }
  return;
}

Assistant:

void kboxinit(gost_ctx * c, const gost_subst_block * b)
{
    int i;

    for (i = 0; i < 256; i++) {
        c->k87[i] = (word32) (b->k8[i >> 4] << 4 | b->k7[i & 15]) << 24;
        c->k65[i] = (b->k6[i >> 4] << 4 | b->k5[i & 15]) << 16;
        c->k43[i] = (b->k4[i >> 4] << 4 | b->k3[i & 15]) << 8;
        c->k21[i] = b->k2[i >> 4] << 4 | b->k1[i & 15];

    }
}